

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::update_line_starts
          (Fl_Text_Display *this,int pos,int charsInserted,int charsDeleted,int linesInserted,
          int linesDeleted,int *scrolled)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_64;
  int local_5c;
  int lineDelta;
  int charDelta;
  int nVisLines;
  int lineOfEnd;
  int lineOfPos;
  int i;
  int *lineStarts;
  int local_20;
  int linesDeleted_local;
  int linesInserted_local;
  int charsDeleted_local;
  int charsInserted_local;
  int pos_local;
  Fl_Text_Display *this_local;
  
  _lineOfPos = this->mLineStarts;
  iVar4 = this->mNVisibleLines;
  iVar1 = charsInserted - charsDeleted;
  iVar2 = linesInserted - linesDeleted;
  if (pos + charsDeleted < this->mFirstChar) {
    this->mTopLineNum = iVar2 + this->mTopLineNum;
    lineOfEnd = 0;
    while( true ) {
      bVar5 = false;
      if (lineOfEnd < iVar4) {
        bVar5 = _lineOfPos[lineOfEnd] != -1;
      }
      if (!bVar5) break;
      _lineOfPos[lineOfEnd] = iVar1 + _lineOfPos[lineOfEnd];
      lineOfEnd = lineOfEnd + 1;
    }
    this->mFirstChar = iVar1 + this->mFirstChar;
    this->mLastChar = iVar1 + this->mLastChar;
    *scrolled = 0;
  }
  else {
    lineStarts._4_4_ = linesDeleted;
    local_20 = linesInserted;
    linesDeleted_local = charsDeleted;
    linesInserted_local = charsInserted;
    charsDeleted_local = pos;
    _charsInserted_local = this;
    if (pos < this->mFirstChar) {
      iVar3 = position_to_line(this,pos + charsDeleted,&charDelta);
      if (((iVar3 == 0) || (charDelta = charDelta + 1, iVar4 <= charDelta)) ||
         (_lineOfPos[charDelta] == -1)) {
        if (this->mNBufferLines + iVar2 < this->mTopLineNum) {
          this->mTopLineNum = 1;
          this->mFirstChar = 0;
        }
        else {
          iVar1 = skip_lines(this,0,this->mTopLineNum + -1,true);
          this->mFirstChar = iVar1;
        }
      }
      else {
        iVar2 = max(1,this->mTopLineNum + iVar2);
        this->mTopLineNum = iVar2;
        iVar1 = rewind_lines(this,_lineOfPos[charDelta] + iVar1,charDelta);
        this->mFirstChar = iVar1;
      }
      calc_line_starts(this,0,iVar4 + -1);
      calc_last_char(this);
      *scrolled = 1;
    }
    else if (this->mLastChar < pos) {
      iVar4 = empty_vlines(this);
      if (iVar4 == 0) {
        *scrolled = 0;
      }
      else {
        position_to_line(this,charsDeleted_local,&nVisLines);
        calc_line_starts(this,nVisLines,nVisLines + local_20);
        calc_last_char(this);
        *scrolled = 0;
      }
    }
    else {
      position_to_line(this,pos,&nVisLines);
      lineOfEnd = nVisLines;
      if (iVar2 == 0) {
        while( true ) {
          lineOfEnd = lineOfEnd + 1;
          bVar5 = false;
          if (lineOfEnd < iVar4) {
            bVar5 = _lineOfPos[lineOfEnd] != -1;
          }
          if (!bVar5) break;
          _lineOfPos[lineOfEnd] = iVar1 + _lineOfPos[lineOfEnd];
        }
      }
      else {
        lineOfEnd = iVar4;
        if (iVar2 < 1) {
          for (lineOfEnd = max(0,nVisLines + 1); lineOfEnd < iVar4 + iVar2;
              lineOfEnd = lineOfEnd + 1) {
            local_64 = iVar1;
            if (_lineOfPos[lineOfEnd - iVar2] == -1) {
              local_64 = 0;
            }
            _lineOfPos[lineOfEnd] = _lineOfPos[lineOfEnd - iVar2] + local_64;
          }
        }
        else {
          while (lineOfEnd = lineOfEnd + -1, nVisLines + iVar2 + 1 <= lineOfEnd) {
            local_5c = iVar1;
            if (_lineOfPos[lineOfEnd - iVar2] == -1) {
              local_5c = 0;
            }
            _lineOfPos[lineOfEnd] = _lineOfPos[lineOfEnd - iVar2] + local_5c;
          }
        }
      }
      if (-1 < local_20) {
        calc_line_starts(this,nVisLines + 1,nVisLines + local_20);
      }
      if (iVar2 < 0) {
        calc_line_starts(this,iVar4 + iVar2,iVar4);
      }
      calc_last_char(this);
      *scrolled = 0;
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::update_line_starts(int pos, int charsInserted,
                                         int charsDeleted, int linesInserted,
                                         int linesDeleted, int *scrolled ) {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int *lineStarts = mLineStarts;
  int i, lineOfPos, lineOfEnd, nVisLines = mNVisibleLines;
  int charDelta = charsInserted - charsDeleted;
  int lineDelta = linesInserted - linesDeleted;

  /* If all of the changes were before the displayed text, the display
   doesn't change, just update the top line num and offset the line
   start entries and first and last characters */
  if ( pos + charsDeleted < mFirstChar ) {
    mTopLineNum += lineDelta;
    for ( i = 0; i < nVisLines && lineStarts[i] != -1; i++ )
      lineStarts[ i ] += charDelta;
    mFirstChar += charDelta;
    mLastChar += charDelta;
    *scrolled = 0;
    return;
  }

  /* The change began before the beginning of the displayed text, but
   part or all of the displayed text was deleted */
  if ( pos < mFirstChar ) {
    /* If some text remains in the window, anchor on that  */
    if ( position_to_line( pos + charsDeleted, &lineOfEnd ) &&
        ++lineOfEnd < nVisLines && lineStarts[ lineOfEnd ] != -1 ) {
      mTopLineNum = max( 1, mTopLineNum + lineDelta );
      mFirstChar = rewind_lines(lineStarts[ lineOfEnd ] + charDelta, lineOfEnd );
      /* Otherwise anchor on original line number and recount everything */
    } else {
      if ( mTopLineNum > mNBufferLines + lineDelta ) {
        mTopLineNum = 1;
        mFirstChar = 0;
      } else
        mFirstChar = skip_lines( 0, mTopLineNum - 1, true );
    }
    calc_line_starts( 0, nVisLines - 1 );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 1;
    return;
  }

  /* If the change was in the middle of the displayed text (it usually is),
   salvage as much of the line starts array as possible by moving and
   offsetting the entries after the changed area, and re-counting the
   added lines or the lines beyond the salvaged part of the line starts
   array */
  if ( pos <= mLastChar ) {
    /* find line on which the change began */
    position_to_line( pos, &lineOfPos );
    /* salvage line starts after the changed area */
    if ( lineDelta == 0 ) {
      for ( i = lineOfPos + 1; i < nVisLines && lineStarts[ i ] != -1; i++ )
        lineStarts[ i ] += charDelta;
    } else if ( lineDelta > 0 ) {
      for ( i = nVisLines - 1; i >= lineOfPos + lineDelta + 1; i-- )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    } else /* (lineDelta < 0) */ {
      for ( i = max( 0, lineOfPos + 1 ); i < nVisLines + lineDelta; i++ )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    }
    /* fill in the missing line starts */
    if ( linesInserted >= 0 )
      calc_line_starts( lineOfPos + 1, lineOfPos + linesInserted );
    if ( lineDelta < 0 )
      calc_line_starts( nVisLines + lineDelta, nVisLines );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was past the end of the displayed text, but displayable by virtue
   of being an insert at the end of the buffer into visible blank lines */
  if ( empty_vlines() ) {
    position_to_line( pos, &lineOfPos );
    calc_line_starts( lineOfPos, lineOfPos + linesInserted );
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was beyond the end of the buffer and not visible, do nothing */
  *scrolled = 0;
}